

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O0

void google::protobuf::compiler::javanano::anon_unknown_3::SetMessageVariables
               (Params *params,FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  FieldDescriptor *this;
  uint uVar2;
  Type TVar3;
  uint32 uVar4;
  mapped_type *pmVar5;
  Params *params_00;
  char *pcVar6;
  Descriptor *this_00;
  string *psVar7;
  Descriptor *in_RCX;
  int i;
  uint i_00;
  FieldDescriptor *field;
  allocator<char> local_221;
  key_type local_220;
  string local_200;
  allocator<char> local_1d9;
  key_type local_1d8;
  allocator<char> local_1b1;
  key_type local_1b0;
  allocator<char> local_189;
  key_type local_188;
  string local_168;
  allocator<char> local_141;
  key_type local_140;
  string local_120;
  allocator<char> local_f9;
  key_type local_f8;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  key_type local_90;
  string local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  Params *params_local;
  
  local_20 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)descriptor;
  descriptor_local = (FieldDescriptor *)params;
  UnderscoresToCamelCase_abi_cxx11_(&local_60,(javanano *)descriptor,(FieldDescriptor *)variables);
  RenameJavaKeywords(&local_40,&local_60);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_90);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d8,(javanano *)variables_local,field);
  RenameJavaKeywords(&local_b8,&local_d8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"capitalized_name",&local_f9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar2 = FieldDescriptor::number((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_120,(protobuf *)(ulong)uVar2,i);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"number",&local_141);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_140);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_120);
  this = descriptor_local;
  params_00 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  ClassName_abi_cxx11_(&local_168,(javanano *)this,params_00,in_RCX);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"type",&local_189);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_188);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_168);
  TVar3 = FieldDescriptor::type((FieldDescriptor *)variables_local);
  pmVar1 = local_20;
  pcVar6 = "Message";
  if (TVar3 == TYPE_GROUP) {
    pcVar6 = "Group";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"group_or_message",&local_1b1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1b0);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  this_00 = FieldDescriptor::containing_type((FieldDescriptor *)variables_local);
  psVar7 = Descriptor::name_abi_cxx11_(this_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"message_name",&local_1d9)
  ;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  uVar4 = internal::WireFormat::MakeTag((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_200,(protobuf *)(ulong)uVar4,i_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"tag",&local_221);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_220);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_200);
  return;
}

Assistant:

void SetMessageVariables(const Params& params,
    const FieldDescriptor* descriptor, map<string, string>* variables) {
  (*variables)["name"] =
    RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  (*variables)["capitalized_name"] =
    RenameJavaKeywords(UnderscoresToCapitalizedCamelCase(descriptor));
  (*variables)["number"] = SimpleItoa(descriptor->number());
  (*variables)["type"] = ClassName(params, descriptor->message_type());
  (*variables)["group_or_message"] =
    (descriptor->type() == FieldDescriptor::TYPE_GROUP) ?
    "Group" : "Message";
  (*variables)["message_name"] = descriptor->containing_type()->name();
  //(*variables)["message_type"] = descriptor->message_type()->name();
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
}